

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_string.c
# Opt level: O1

char * d_string_free(DString *ripString,_Bool freeCharacterData)

{
  char *__ptr;
  
  if (ripString == (DString *)0x0) {
    __ptr = (char *)0x0;
  }
  else {
    __ptr = ripString->str;
    if (freeCharacterData) {
      if (__ptr != (char *)0x0) {
        free(__ptr);
      }
      __ptr = (char *)0x0;
    }
    free(ripString);
  }
  return __ptr;
}

Assistant:

char * d_string_free(DString * ripString, bool freeCharacterData) {
	if (ripString == NULL) {
		return NULL;
	}

	char * returnedString = ripString->str;

	if (freeCharacterData) {
		if (ripString->str != NULL) {
			free(ripString->str);
		}

		returnedString = NULL;
	}

	free(ripString);

	return returnedString;
}